

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

errr init_x11(wchar_t argc,char **argv)

{
  int iVar1;
  undefined4 uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  infofnt *piVar6;
  _Bool _Var7;
  uint uVar8;
  wchar_t wVar9;
  uint32_t uVar10;
  uint uVar11;
  int iVar12;
  errr eVar13;
  ang_file *paVar14;
  ushort **ppuVar15;
  char *pcVar16;
  Display *pDVar17;
  XkbDescPtr xkb;
  XFontSet p_Var18;
  infowin *piVar19;
  Window WVar20;
  XClassHint *pXVar21;
  __int32_t **pp_Var22;
  XSizeHints *pXVar23;
  byte *pbVar24;
  byte bVar25;
  int iVar26;
  wchar_t wVar27;
  long lVar29;
  uint8_t uVar30;
  int iVar31;
  ulong uVar32;
  char *pcVar33;
  uint8_t uVar34;
  wchar_t wVar35;
  Pixell PVar36;
  Pixell PVar37;
  wchar_t wVar38;
  ulong uVar39;
  long lVar40;
  infoclr **ppiVar41;
  infowin *iwin;
  term_data *ptVar42;
  bool bVar43;
  int local_a78;
  int local_a74;
  wchar_t local_a70;
  wchar_t local_a6c;
  wchar_t y;
  term_data *local_a50;
  char **missing;
  ulong local_a40;
  uint b;
  uint h;
  uint w;
  char *local_a28;
  undefined1 local_a1c [4];
  char res_class [20];
  char res_name [20];
  int local_99c;
  long local_990;
  char cmd [40];
  char local_938 [256];
  char buf [1024];
  char buf_1 [1024];
  ulong uVar28;
  
  pcVar33 = "";
  uVar39 = 0xffffffffffffffff;
  for (lVar40 = 1; lVar40 < argc; lVar40 = lVar40 + 1) {
    _Var7 = prefix(argv[lVar40],"-d");
    if (_Var7) {
      pcVar33 = argv[lVar40] + 2;
    }
    else {
      _Var7 = prefix(argv[lVar40],"-n");
      if (_Var7) {
        uVar8 = atoi(argv[lVar40] + 2);
        if ((int)uVar8 < 9) {
          uVar39 = (ulong)uVar8;
          if ((int)uVar8 < 2) {
            uVar39 = 1;
          }
        }
        else {
          uVar39 = 8;
        }
      }
      else {
        _Var7 = prefix(argv[lVar40],"-x");
        if (_Var7) {
          x11_prefs = argv[lVar40] + 2;
        }
        else {
          plog_fmt("Ignoring option: %s");
        }
      }
    }
  }
  if ((int)uVar39 == -1) {
    path_build(settings,0x400,ANGBAND_DIR_USER,"x11-settings.prf");
    uVar39 = 1;
    paVar14 = file_open(settings,MODE_READ,FTYPE_TEXT);
    if (paVar14 != (ang_file *)0x0) {
      uVar39 = 1;
      while (_Var7 = file_getl(paVar14,buf,0x400), _Var7) {
        uVar28 = (ulong)(byte)buf[0];
        if (((((uVar28 != 0) && (ppuVar15 = __ctype_b_loc(), uVar28 != 0x23)) &&
             (((*ppuVar15)[uVar28] & 0x2000) == 0)) &&
            ((_Var7 = prefix(buf,"TERM_WINS"), _Var7 &&
             (pcVar16 = strchr(buf,0x3d), pcVar16 != (char *)0x0)))) &&
           (uVar8 = atoi(pcVar16 + 1), 0 < (int)uVar8)) {
          uVar39 = (ulong)uVar8;
        }
      }
      file_close(paVar14);
    }
  }
  pDVar17 = (Display *)XOpenDisplay(pcVar33);
  if (pDVar17 == (Display *)0x0) {
    eVar13 = -1;
  }
  else {
    metadpy_default_16 = metadpy_default_16 | 4;
    metadpy_default_1 = *(long *)(pDVar17 + 0xe8) + (long)*(int *)(pDVar17 + 0xe0) * 0x80;
    metadpy_default_2 =
         *(undefined8 *)(*(long *)(pDVar17 + 0xe8) + 0x10 + (long)*(int *)(pDVar17 + 0xe0) * 0x80);
    metadpy_default_4 = 8;
    metadpy_default_5 = 0x40;
    metadpy_default_0 = pDVar17;
    xkb = (XkbDescPtr)XkbGetKeyboard(pDVar17,0x7f,0x100);
    if (xkb != (XkbDescPtr)0x0) {
      metadpy_default_4 = xkb_mask_modifier(xkb,"Alt");
      metadpy_default_5 = xkb_mask_modifier(xkb,"Super");
      XkbFreeKeyboard(xkb,0,1);
    }
    metadpy_default_6 = *(undefined8 *)(pDVar17 + 0xd8);
    uVar8 = *(uint *)(metadpy_default_1 + 0x38);
    metadpy_default_13 = *(Pixell *)(metadpy_default_1 + 0x60);
    metadpy_default_14 = *(Pixell *)(metadpy_default_1 + 0x58);
    metadpy_default_15 = ~(-1L << ((byte)uVar8 & 0x3f));
    bVar25 = (uVar8 >= 2) * '\x02' | uVar8 < 2;
    uVar28 = (ulong)CONCAT31((int3)(uVar8 >> 8),bVar25);
    metadpy_default_16 = metadpy_default_16 & 0xfc | bVar25;
    term_windows_open = (wchar_t)uVar39;
    local_a40 = uVar39;
    xor = (infoclr *)mem_zalloc(0x20);
    PVar37 = metadpy_default_14;
    PVar36 = metadpy_default_13;
    Infoclr = xor;
    wVar9 = Infoclr_Opcode("xor");
    Infoclr_init_data(PVar37,PVar36,wVar9,(wchar_t)uVar28);
    ppiVar41 = clr;
    for (uVar39 = 0; uVar39 != 0x60; uVar39 = uVar39 + 1) {
      Infoclr = (infoclr *)mem_zalloc(0x20);
      *ppiVar41 = Infoclr;
      uVar8 = (uint)uVar39 & 0x1f;
      uVar32 = (ulong)(uVar8 * 4);
      uVar30 = angband_color_table[0][uVar32 + 1];
      color_table_x11[0][uVar32] = angband_color_table[0][uVar32];
      color_table_x11[0][uVar32 + 1] = uVar30;
      uVar34 = angband_color_table[0][uVar32 + 2];
      uVar28 = CONCAT71((int7)(uVar28 >> 8),uVar34);
      color_table_x11[0][uVar32 + 2] = uVar34;
      bVar25 = angband_color_table[0][uVar32 + 3];
      color_table_x11[0][uVar32 + 3] = bVar25;
      PVar36 = metadpy_default_13;
      if ((metadpy_default_16 & 2) == 0) {
        PVar37 = metadpy_default_13;
        if (uVar39 != 0) {
          PVar37 = metadpy_default_14;
        }
        wVar9 = Infoclr_Opcode("cpy");
      }
      else {
        uVar28 = (ulong)bVar25;
        uVar10 = create_pixel(metadpy_default_0,uVar30,uVar34,bVar25);
        PVar37 = (Pixell)uVar10;
        uVar11 = (uint)(uVar39 >> 5) & 0x7ffffff;
        uVar30 = color_table_x11[0x1c][2];
        uVar34 = color_table_x11[0x1c][1];
        bVar25 = color_table_x11[0x1c][3];
        if (uVar11 == 2) {
LAB_00123ca1:
          uVar28 = (ulong)bVar25;
          uVar10 = create_pixel(metadpy_default_0,uVar34,uVar30,bVar25);
          PVar36 = (ulong)uVar10;
        }
        else {
          PVar36 = metadpy_default_13;
          if (uVar11 == 1) {
            uVar30 = color_table_x11[uVar8][2];
            uVar34 = color_table_x11[uVar8][1];
            bVar25 = color_table_x11[uVar8][3];
            goto LAB_00123ca1;
          }
        }
        wVar9 = Infoclr_Opcode("cpy");
      }
      Infoclr_init_data(PVar37,PVar36,wVar9,(wchar_t)uVar28);
      ppiVar41 = ppiVar41 + 1;
    }
    iVar26 = (int)local_a40;
    local_a40 = local_a40 & 0xffffffff;
    if (iVar26 < 1) {
      local_a40 = 0;
    }
    for (uVar39 = 0; uVar39 != local_a40; uVar39 = uVar39 + 1) {
      strnfmt(buf_1,0x50,"ANGBAND_X11_FONT_%d",uVar39 & 0xffffffff);
      pcVar33 = getenv(buf_1);
      if (((pcVar33 == (char *)0x0) &&
          (pcVar33 = getenv("ANGBAND_X11_FONT"), pcVar33 == (char *)0x0)) &&
         (pcVar33 = "9x15", uVar39 < 8)) {
        pcVar33 = (char *)((long)&DAT_00242284 + (long)(int)(&DAT_00242284)[uVar39]);
      }
      local_a50 = data + uVar39;
      local_a28 = pcVar33;
      paVar14 = file_open(settings,MODE_READ,FTYPE_TEXT);
      if (paVar14 == (ang_file *)0x0) {
        local_a78 = 0;
        iVar26 = 1;
        local_a70 = L'\x18';
        local_a6c = L'P';
        local_a74 = 0;
        iVar5 = iVar26;
      }
      else {
        local_a78 = 0;
        local_a74 = 0;
        local_a70 = L'\x18';
        local_a6c = L'P';
        iVar26 = 1;
        iVar5 = 1;
        while (_Var7 = file_getl(paVar14,buf_1,0x400), _Var7) {
          uVar28 = (ulong)(byte)buf_1[0];
          if (((uVar28 != 0) && (ppuVar15 = __ctype_b_loc(), uVar28 != 0x23)) &&
             (((*ppuVar15)[uVar28] & 0x2000) == 0)) {
            strnfmt(cmd,0x28,"AT_X_%d",uVar39 & 0xffffffff);
            _Var7 = prefix(buf_1,cmd);
            if (_Var7) {
              pcVar33 = strchr(buf_1,0x3d);
              local_a74 = -1;
              if (pcVar33 != (char *)0x0) {
                local_a74 = atoi(pcVar33 + 1);
              }
            }
            else {
              strnfmt(cmd,0x28,"AT_Y_%d",uVar39 & 0xffffffff);
              _Var7 = prefix(buf_1,cmd);
              if (_Var7) {
                pcVar33 = strchr(buf_1,0x3d);
                local_a78 = -1;
                if (pcVar33 != (char *)0x0) {
                  local_a78 = atoi(pcVar33 + 1);
                }
              }
              else {
                strnfmt(cmd,0x28,"COLS_%d",uVar39 & 0xffffffff);
                _Var7 = prefix(buf_1,cmd);
                if (_Var7) {
                  pcVar33 = strchr(buf_1,0x3d);
                  if ((pcVar33 != (char *)0x0) && (wVar9 = atoi(pcVar33 + 1), L'\0' < wVar9)) {
                    local_a6c = wVar9;
                  }
                }
                else {
                  strnfmt(cmd,0x28,"ROWS_%d",uVar39 & 0xffffffff);
                  _Var7 = prefix(buf_1,cmd);
                  if (_Var7) {
                    pcVar33 = strchr(buf_1,0x3d);
                    if ((pcVar33 != (char *)0x0) && (wVar9 = atoi(pcVar33 + 1), L'\0' < wVar9)) {
                      local_a70 = wVar9;
                    }
                  }
                  else {
                    strnfmt(cmd,0x28,"IBOX_%d",uVar39 & 0xffffffff);
                    _Var7 = prefix(buf_1,cmd);
                    if (_Var7) {
                      pcVar33 = strchr(buf_1,0x3d);
                      if ((pcVar33 != (char *)0x0) && (iVar12 = atoi(pcVar33 + 1), 0 < iVar12)) {
                        iVar26 = iVar12;
                      }
                    }
                    else {
                      strnfmt(cmd,0x28,"IBOY_%d",uVar39 & 0xffffffff);
                      _Var7 = prefix(buf_1,cmd);
                      if (_Var7) {
                        pcVar33 = strchr(buf_1,0x3d);
                        if ((pcVar33 != (char *)0x0) && (iVar12 = atoi(pcVar33 + 1), 0 < iVar12)) {
                          iVar5 = iVar12;
                        }
                      }
                      else {
                        strnfmt(cmd,0x28,"FONT_%d",uVar39 & 0xffffffff);
                        _Var7 = prefix(buf_1,cmd);
                        if (_Var7) {
                          pcVar33 = strchr(buf_1,0x3d);
                          if (pcVar33 != (char *)0x0) {
                            my_strcpy(local_938,pcVar33 + 1,0x100);
                            local_a28 = local_938;
                          }
                        }
                        else {
                          strnfmt(cmd,0x28,"TILE_WIDTH_%d",uVar39 & 0xffffffff);
                          _Var7 = prefix(buf_1,cmd);
                          if (_Var7) {
                            pcVar33 = strchr(buf_1,0x3d);
                            if ((pcVar33 != (char *)0x0) &&
                               (wVar9 = atoi(pcVar33 + 1), L'\0' < wVar9)) {
                              local_a50->tile_wid = wVar9;
                            }
                          }
                          else {
                            strnfmt(cmd,0x28,"TILE_HEIGHT_%d",uVar39 & 0xffffffff);
                            _Var7 = prefix(buf_1,cmd);
                            if (((_Var7) && (pcVar33 = strchr(buf_1,0x3d), pcVar33 != (char *)0x0))
                               && (wVar9 = atoi(pcVar33 + 1), L'\0' < wVar9)) {
                              local_a50->tile_hgt = wVar9;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        file_close(paVar14);
      }
      strnfmt(buf_1,0x400,"ANGBAND_X11_AT_X_%d",uVar39 & 0xffffffff);
      pcVar16 = getenv(buf_1);
      pcVar33 = local_a28;
      ptVar42 = local_a50;
      if ((pcVar16 != (char *)0x0) && (iVar12 = atoi(pcVar16), 0 < iVar12)) {
        local_a74 = iVar12;
      }
      strnfmt(buf_1,0x400,"ANGBAND_X11_AT_Y_%d",uVar39 & 0xffffffff);
      pcVar16 = getenv(buf_1);
      if ((pcVar16 != (char *)0x0) && (iVar12 = atoi(pcVar16), 0 < iVar12)) {
        local_a78 = iVar12;
      }
      strnfmt(buf_1,0x400,"ANGBAND_X11_COLS_%d",uVar39 & 0xffffffff);
      pcVar16 = getenv(buf_1);
      if ((pcVar16 != (char *)0x0) && (wVar9 = atoi(pcVar16), L'\0' < wVar9)) {
        local_a6c = wVar9;
      }
      strnfmt(buf_1,0x400,"ANGBAND_X11_ROWS_%d",uVar39 & 0xffffffff);
      pcVar16 = getenv(buf_1);
      if ((pcVar16 != (char *)0x0) && (wVar9 = atoi(pcVar16), L'\0' < wVar9)) {
        local_a70 = wVar9;
      }
      strnfmt(buf_1,0x400,"ANGBAND_X11_IBOX_%d",uVar39 & 0xffffffff);
      pcVar16 = getenv(buf_1);
      if ((pcVar16 != (char *)0x0) && (iVar12 = atoi(pcVar16), 0 < iVar12)) {
        iVar26 = iVar12;
      }
      strnfmt(buf_1,0x400,"ANGBAND_X11_IBOY_%d",uVar39 & 0xffffffff);
      pcVar16 = getenv(buf_1);
      if ((pcVar16 != (char *)0x0) && (iVar12 = atoi(pcVar16), 0 < iVar12)) {
        iVar5 = iVar12;
      }
      strnfmt(buf_1,0x400,"ANGBAND_X11_FONT_%d",uVar39 & 0xffffffff);
      pcVar16 = getenv(buf_1);
      if (pcVar16 != (char *)0x0) {
        pcVar33 = pcVar16;
      }
      if (uVar39 == 0) {
        if (local_a6c < L'Q') {
          local_a6c = L'P';
        }
        if (local_a70 < L'\x19') {
          local_a70 = L'\x18';
        }
      }
      Infofnt = (infofnt *)mem_zalloc(0x20);
      ptVar42->fnt = Infofnt;
      if ((pcVar33 == (char *)0x0) ||
         (p_Var18 = (XFontSet)XCreateFontSet(metadpy_default_0,pcVar33,&missing,&y,0),
         p_Var18 == (XFontSet)0x0)) {
        quit_fmt("Couldn\'t load the requested font. (%s)",pcVar33);
      }
      else {
        if (y != L'\0') {
          XFreeStringList(missing);
        }
        piVar6 = Infofnt;
        Infofnt->name = (char *)0x0;
        piVar6->wid = 0;
        piVar6->twid = 0;
        piVar6->hgt = 0;
        piVar6->asc = 0;
        *(undefined8 *)&piVar6->off = 0;
        piVar6->fs = p_Var18;
        lVar40 = XExtentsOfFontSet(p_Var18);
        iVar12 = XFontsOfFontSet(p_Var18,res_name,res_class);
        piVar6->asc = 0;
        iVar31 = 0;
        if (iVar12 < 1) {
          iVar12 = iVar31;
        }
        while( true ) {
          lVar29 = res_name._0_8_ + 8;
          bVar43 = iVar12 == 0;
          iVar12 = iVar12 + -1;
          if (bVar43) break;
          iVar1 = *(int *)(*(long *)res_name._0_8_ + 0x58);
          res_name._0_8_ = lVar29;
          if ((short)iVar31 < iVar1) {
            piVar6->asc = (int16_t)iVar1;
            iVar31 = iVar1;
          }
        }
        uVar2 = *(undefined4 *)(lVar40 + 0xc);
        piVar6->wid = (int16_t)uVar2;
        piVar6->twid = (short)uVar2;
        piVar6->hgt = (short)((uint)uVar2 >> 0x10);
        pcVar33 = string_make(pcVar33);
        piVar6 = Infofnt;
        Infofnt->name = pcVar33;
        piVar6->field_0x19 = piVar6->field_0x19 | 3;
        ptVar42 = local_a50;
      }
      wVar9 = ptVar42->tile_wid;
      if (wVar9 < L'\x01') {
        wVar9 = (wchar_t)ptVar42->fnt->twid;
        ptVar42->tile_wid = wVar9;
      }
      wVar27 = ptVar42->tile_hgt;
      if (wVar27 < L'\x01') {
        wVar27 = (wchar_t)ptVar42->fnt->hgt;
        ptVar42->tile_hgt = wVar27;
      }
      ptVar42->tile_wid2 = wVar9;
      piVar19 = (infowin *)mem_zalloc(0x28);
      ptVar42->win = piVar19;
      PVar37 = metadpy_default_14;
      PVar36 = metadpy_default_13;
      Infowin = piVar19;
      piVar19->b = 0;
      piVar19->byte1 = '\0';
      *(undefined5 *)&piVar19->field_0x23 = 0;
      piVar19->win = 0;
      piVar19->mask = 0;
      piVar19->ox = 0;
      piVar19->oy = 0;
      piVar19->x = 0;
      piVar19->y = 0;
      piVar19->x_save = 0;
      piVar19->y_save = 0;
      piVar19->w = 0;
      piVar19->h = 0;
      WVar20 = XCreateSimpleWindow(metadpy_default_0,metadpy_default_2,local_a74,local_a78,
                                   wVar9 * local_a6c + iVar26 * 2,wVar27 * local_a70 + iVar5 * 2,0,
                                   PVar37,PVar36);
      XSelectInput(metadpy_default_0,WVar20,0);
      piVar19 = Infowin;
      Infowin->field_0x23 = Infowin->field_0x23 | 8;
      piVar19->win = WVar20;
      XGetGeometry(metadpy_default_0,WVar20,res_class,&missing,&y,&w,&h,&b,local_a1c);
      piVar19->x = (int16_t)missing;
      piVar19->y = (int16_t)y;
      piVar19->x_save = (int16_t)missing;
      piVar19->y_save = (int16_t)y;
      piVar19->w = (int16_t)w;
      piVar19->h = (int16_t)h;
      piVar19->b = (uint16_t)b;
      XGetWindowAttributes(metadpy_default_0,WVar20,res_name);
      piVar19->mask = local_990;
      piVar19->field_0x23 = piVar19->field_0x23 & 0xfc | local_99c != 0 | 2;
      piVar19 = Infowin;
      Infowin->mask = 0x28005;
      XSelectInput(metadpy_default_0,piVar19->win,0x28005);
      missing = (char **)res_name;
      my_strcpy(res_name,angband_term_name[uVar39],0x80);
      iVar12 = XStringListToTextProperty(&missing,1,res_class);
      if (iVar12 != 0) {
        XSetWMName(metadpy_default_0,Infowin->win,res_class);
      }
      XFree(res_class._0_8_);
      piVar19 = Infowin;
      Infowin->ox = (int16_t)iVar26;
      piVar19->oy = (int16_t)iVar5;
      pXVar21 = (XClassHint *)XAllocClassHint();
      if (pXVar21 == (XClassHint *)0x0) {
        quit("XAllocClassHint failed");
      }
      my_strcpy(res_name,angband_term_name[uVar39],0x14);
      pp_Var22 = __ctype_tolower_loc();
      res_name[0] = (char)(*pp_Var22)[res_name._0_8_ & 0xff];
      pXVar21->res_name = res_name;
      my_strcpy(res_class,"Angband",0x14);
      pXVar21->res_class = res_class;
      XSetClassHint(metadpy_default_0,Infowin->win,pXVar21);
      pXVar23 = (XSizeHints *)XAllocSizeHints();
      if (pXVar23 == (XSizeHints *)0x0) {
        quit("XAllocSizeHints failed");
      }
      wVar9 = local_a50->tile_wid;
      if (uVar39 == 0) {
        wVar35 = wVar9 * 0x50;
        wVar27 = local_a50->tile_hgt;
        wVar38 = wVar27 * 0x18;
      }
      else {
        wVar27 = local_a50->tile_hgt;
        wVar38 = wVar27;
        wVar35 = wVar9;
      }
      wVar3 = iVar26 * 2;
      wVar4 = iVar5 * 2;
      pXVar23->min_width = wVar35 + wVar3;
      pXVar23->min_height = wVar38 + wVar4;
      pXVar23->max_width = wVar9 * 0xff + wVar3;
      pXVar23->max_height = wVar27 * 0xff + wVar4;
      pXVar23->width_inc = wVar9;
      pXVar23->height_inc = wVar27;
      pXVar23->flags = (ulong)(local_a74 != 0 || local_a78 != 0) | 0x170;
      pXVar23->base_width = wVar3;
      pXVar23->base_height = wVar4;
      XSetWMNormalHints(metadpy_default_0,Infowin->win,pXVar23);
      pbVar24 = (byte *)XAllocWMHints();
      if (pbVar24 == (byte *)0x0) {
        quit("XAllocWMHints failed");
      }
      *pbVar24 = *pbVar24 | 0x40;
      *(Window *)(pbVar24 + 0x30) = (data[0].win)->win;
      XSetWMHints(metadpy_default_0,Infowin->win,pbVar24);
      XFree(pbVar24);
      XMapWindow(metadpy_default_0,Infowin->win);
      ptVar42 = local_a50;
      local_a50->sizeh = pXVar23;
      local_a50->classh = pXVar21;
      if ((-1 < local_a74) && (-1 < local_a78)) {
        XMoveWindow(metadpy_default_0,Infowin->win,local_a74,local_a78);
      }
      wVar9 = L'\x10';
      if (uVar39 == 0) {
        wVar9 = L'Ѐ';
      }
      term_init(&ptVar42->t,local_a6c,local_a70,wVar9);
      (ptVar42->t).soft_cursor = true;
      (ptVar42->t).complex_input = true;
      (ptVar42->t).xtra_hook = Term_xtra_x11;
      (ptVar42->t).curs_hook = Term_curs_x11;
      (ptVar42->t).bigcurs_hook = Term_bigcurs_x11;
      (ptVar42->t).wipe_hook = Term_wipe_x11;
      (ptVar42->t).text_hook = Term_text_x11;
      (ptVar42->t).data = ptVar42;
      Term_activate(&ptVar42->t);
      angband_term[uVar39] = Term;
    }
    Infowin = data[0].win;
    XRaiseWindow(metadpy_default_0,(data[0].win)->win);
    Term_activate(&data[0].t);
    quit_aux = hook_quit;
    eVar13 = 0;
  }
  return eVar13;
}

Assistant:

errr init_x11(int argc, char **argv)
{
	int i;

	const char *dpy_name = "";

	int num_term = -1;

	ang_file *fff;

	char buf[1024];
	const char *str;
	int val;

	/* Parse args */
	for (i = 1; i < argc; i++) {
		if (prefix(argv[i], "-d"))
		{
			dpy_name = &argv[i][2];
			continue;
		}

		if (prefix(argv[i], "-n")) {
			num_term = atoi(&argv[i][2]);
			if (num_term > MAX_TERM_DATA) num_term = MAX_TERM_DATA;
			else if (num_term < 1) num_term = 1;
			continue;
		}

		if (prefix(argv[i], "-x")) {
			x11_prefs = argv[i] + 2;
			continue;
		}

		plog_fmt("Ignoring option: %s", argv[i]);
	}


	if (num_term == -1) {
		num_term = 1;

		/* Build the filename */
		(void)path_build(settings, sizeof(settings), ANGBAND_DIR_USER,
						 "x11-settings.prf");

		/* Open the file */
		fff = file_open(settings, MODE_READ, FTYPE_TEXT);

		/* File exists */
		if (fff) {
			/* Process the file */
			while (file_getl(fff, buf, sizeof(buf))) {
				/* Skip "empty" lines */
				if (!buf[0]) continue;
	
				/* Skip "blank" lines */
				if (isspace((unsigned char)buf[0])) continue;
	
				/* Skip comments */
				if (buf[0] == '#') continue;
	
				/* Number of terminal windows */
				if (prefix(buf, "TERM_WINS")) {
					str = strstr(buf, "=");
					val = (str != NULL) ? atoi(str + 1) : -1;
					if (val > 0) num_term = val;
					continue;
				}
			}
	
			/* Close */
			(void)file_close(fff);
		}
	}


	/* Init the Metadpy if possible */
	if (Metadpy_init_name(dpy_name)) return (-1);

	/* Remember the number of terminal windows */
	term_windows_open = num_term;

	/* Prepare cursor color */
	xor = mem_zalloc(sizeof(infoclr));
	Infoclr_set(xor);
	Infoclr_init_ppn(Metadpy->fg, Metadpy->bg, "xor", 0);


	/* Prepare normal colors */
	for (i = 0; i < MAX_COLORS * BG_MAX; ++i) {
		Pixell pixel;

		clr[i] = mem_zalloc(sizeof(infoclr));

		Infoclr_set(clr[i]);

		/* Acquire Angband colors */
		color_table_x11[i % MAX_COLORS][0] =
			angband_color_table[i % MAX_COLORS][0];
		color_table_x11[i % MAX_COLORS][1] =
			angband_color_table[i % MAX_COLORS][1];
		color_table_x11[i % MAX_COLORS][2] =
			angband_color_table[i % MAX_COLORS][2];
		color_table_x11[i % MAX_COLORS][3] =
			angband_color_table[i % MAX_COLORS][3];

		/* Default to monochrome */
		pixel = ((i == 0) ? Metadpy->bg : Metadpy->fg);

		/* Handle color 
		   This block of code has added support for background colours
                   (from Sil) */
		if (Metadpy->color) {
			Pixell backpixel;
			/* Create pixel */
			pixel = create_pixel(Metadpy->dpy,
					     color_table_x11[i % MAX_COLORS][1],
					     color_table_x11[i % MAX_COLORS][2],
					     color_table_x11[i % MAX_COLORS][3]);
			switch (i / MAX_COLORS)
			{
				case BG_BLACK:
					/* Default Background */
					Infoclr_init_ppn(pixel, Metadpy->bg, "cpy", 0);
					break;
				case BG_SAME:
					/* Background same as foreground */
					backpixel = create_pixel(Metadpy->dpy,
											 color_table_x11[i % MAX_COLORS][1],
											 color_table_x11[i % MAX_COLORS][2],
											 color_table_x11[i % MAX_COLORS][3]);
					Infoclr_init_ppn(pixel, backpixel, "cpy", 0);
					break;
				case BG_DARK:
					/* Highlight Background */
					backpixel = create_pixel(Metadpy->dpy,
											 color_table_x11[COLOUR_SHADE][1],
											 color_table_x11[COLOUR_SHADE][2],
											 color_table_x11[COLOUR_SHADE][3]);
					Infoclr_init_ppn(pixel, backpixel, "cpy", 0);
					break;
			}
		} else {
			/* Handle monochrome */
		    Infoclr_init_ppn(pixel, Metadpy->bg, "cpy", 0);
		}
	}


	/* Initialize the windows */
	for (i = 0; i < num_term; i++) {
		term_data *td = &data[i];

		/* Initialize the term_data */
		term_data_init(td, i);

		/* Save global entry */
		angband_term[i] = Term;
	}

	/* Raise the "Angband" window */
	Infowin_set(data[0].win);
	Infowin_raise();

	/* Activate the "Angband" window screen */
	Term_activate(&data[0].t);


	/* Activate hook */
	quit_aux = hook_quit;

	/* Success */
	return (0);
}